

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
               (__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                begin,__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                      end,int param_3,uint param_4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Tuple_impl<2UL,_int,_int> _Var5;
  long lVar6;
  bool bVar7;
  long lVar8;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var9;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var10;
  ulong uVar11;
  tuple<long,_int,_int,_int> *ptVar12;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var13;
  ulong uVar14;
  tuple<long,_int,_int,_int> *ptVar15;
  tuple<long,_int,_int,_int> *ptVar16;
  long lVar17;
  tuple<long,_int,_int,_int> *ptVar18;
  tuple<long,_int,_int,_int> *ptVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  pair<__gnu_cxx::__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>,_bool>
  pVar23;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> __cmp_1;
  uint local_6c;
  int local_68;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> local_62;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> local_61;
  tuple<long,_int,_int,_int> *local_60;
  tuple<long,_int,_int,_int> *local_58;
  ulong local_50;
  tuple<long,_int,_int,_int> *local_48;
  tuple<long,_int,_int,_int> *local_40;
  tuple<long,_int,_int,_int> *local_38;
  
  local_58 = end._M_current + -1;
  local_38 = end._M_current + -2;
  local_40 = end._M_current + -3;
  local_6c = param_4;
  local_68 = param_3;
  do {
    lVar8 = (long)end._M_current - (long)begin._M_current;
    if (lVar8 < 0x240) {
      ptVar16 = begin._M_current + 1;
      bVar7 = ptVar16 == end._M_current || begin._M_current == end._M_current;
      if ((local_6c & 1) == 0) {
        _Var10._M_current = begin._M_current;
        if (bVar7) goto LAB_0032c9ee;
        do {
          ptVar18 = ptVar16;
          bVar7 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(ptVar18,_Var10._M_current);
          if (bVar7) {
            iVar1 = (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                    super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
            iVar2 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                    super__Head_base<2UL,_int,_false>._M_head_impl;
            iVar3 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            lVar8 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Head_base<0UL,_long,_false>._M_head_impl;
            do {
              do {
                ptVar16 = _Var10._M_current;
                ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl =
                     (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
                ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                lVar17 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
                ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                     (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                _Var10._M_current = ptVar16 + -1;
              } while (lVar8 < lVar17);
            } while ((lVar8 <= lVar17) &&
                    ((iVar4 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.
                              super__Head_base<1UL,_int,_false>._M_head_impl, iVar3 < iVar4 ||
                     ((iVar3 <= iVar4 &&
                      ((iVar4 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>.
                                _M_head_impl, iVar2 < iVar4 ||
                       ((iVar2 <= iVar4 &&
                        (iVar1 < ((_Var10._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                                 super__Tuple_impl<1UL,_int,_int,_int>.
                                 super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                 super__Head_base<3UL,_int,_false>._M_head_impl))))))))));
            (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar8;
            (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar3;
            (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
            (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
          }
          ptVar16 = ptVar18 + 1;
          _Var10._M_current = ptVar18;
        } while (ptVar18 + 1 != end._M_current);
      }
      else {
        if (bVar7) {
LAB_0032c9ee:
          bVar7 = true;
          _Var10._M_current = begin._M_current;
          goto LAB_0032c9f1;
        }
        lVar8 = 0;
        _Var10._M_current = begin._M_current;
        do {
          ptVar18 = ptVar16;
          bVar7 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(ptVar18,_Var10._M_current);
          if (bVar7) {
            iVar1 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                    super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
            iVar2 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                    super__Head_base<2UL,_int,_false>._M_head_impl;
            iVar3 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            lVar17 = _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            ptVar16 = ptVar18 + -1;
            (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 ((_Var10._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 ((_Var10._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl =
                 ((_Var10._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                 super__Head_base<2UL,_int,_false>._M_head_impl;
            _Var10._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 ((_Var10._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                 super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
            ptVar19 = ptVar18;
            lVar21 = lVar8;
            if (ptVar16 != begin._M_current) {
              do {
                ptVar12 = ptVar16;
                ptVar15 = ptVar12 + -1;
                lVar20 = ptVar12[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
                if (lVar20 <= lVar17) {
                  ptVar16 = ptVar12;
                  if (lVar20 < lVar17) {
                    ptVar19 = ptVar12 + 1;
                    break;
                  }
                  iVar4 = ptVar12[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                          super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl;
                  if ((iVar4 <= iVar3) &&
                     ((iVar4 < iVar3 ||
                      ((iVar4 = ptVar12[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>.
                                _M_head_impl, iVar4 <= iVar2 &&
                       ((iVar4 < iVar2 ||
                        ((ptVar15->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                         super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                         super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl
                         <= iVar1)))))))) break;
                }
                (ptVar12->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Head_base<0UL,_long,_false>._M_head_impl = lVar20;
                (ptVar12->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = ptVar12[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                (ptVar12->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                     ptVar12[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                lVar21 = lVar21 + 0x18;
                ptVar16 = ptVar15;
                ptVar19 = ptVar12;
              } while (lVar21 != 0);
            }
            ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
            ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar3;
            ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
            (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
          }
          lVar8 = lVar8 + -0x18;
          ptVar16 = ptVar18 + 1;
          _Var10._M_current = ptVar18;
        } while (ptVar18 + 1 != end._M_current);
      }
LAB_0032c3be:
      bVar7 = true;
      _Var10._M_current = begin._M_current;
    }
    else {
      uVar11 = (lVar8 >> 3) * -0x5555555555555555;
      uVar22 = uVar11 >> 1;
      ptVar16 = begin._M_current + uVar22;
      if (lVar8 < 0xc01) {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (ptVar16,begin._M_current,local_58);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin._M_current,ptVar16,local_58);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin._M_current + 1,begin._M_current + (uVar22 - 1),local_38);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin._M_current + 2,begin._M_current + uVar22 + 1,local_40);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin._M_current + (uVar22 - 1),ptVar16,begin._M_current + uVar22 + 1);
        lVar8 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Head_base<0UL,_long,_false>._M_head_impl;
        ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Head_base<0UL,_long,_false>._M_head_impl =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Head_base<0UL,_long,_false>._M_head_impl;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
        _M_head_impl = lVar8;
        iVar1 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
        ;
        ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Head_base<1UL,_int,_false>._M_head_impl = iVar1;
        _Var5 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
        ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int> = _Var5;
      }
      if (((local_6c & 1) != 0) ||
         (bVar7 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(begin._M_current + -1,begin._M_current), bVar7)) {
        pVar23 = partition_right<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                           (begin._M_current,end._M_current);
        _Var9 = pVar23.first._M_current;
        lVar17 = (long)_Var9._M_current - (long)begin._M_current;
        uVar14 = (lVar17 >> 3) * -0x5555555555555555;
        _Var10._M_current = _Var9._M_current + 1;
        lVar8 = (long)end._M_current - (long)_Var10._M_current;
        uVar22 = (lVar8 >> 3) * -0x5555555555555555;
        uVar11 = uVar11 >> 3;
        if (((long)uVar14 < (long)uVar11) || ((long)uVar22 < (long)uVar11)) {
          local_68 = local_68 + -1;
          if (local_68 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::tuple<long,int,int,int>>>>
                      (begin,end,&local_62);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::tuple<long,int,int,int>>>>
                      (begin,end,&local_61);
            local_68 = 0;
            goto LAB_0032c9ee;
          }
          if (0x228 < lVar17) {
            uVar14 = uVar14 >> 2;
            lVar21 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar21;
            iVar1 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            ((begin._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            begin._M_current[uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            lVar21 = _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar21;
            iVar1 = _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var9._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var9._M_current[-uVar14].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            if (0xc00 < lVar17) {
              lVar17 = begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
              iVar1 = begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              begin._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              begin._M_current[uVar14 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar17 = begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
              iVar1 = begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              begin._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              begin._M_current[uVar14 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              uVar11 = ~uVar14;
              lVar17 = _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
              iVar1 = _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar21 = -2 - uVar14;
              lVar17 = _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
              iVar1 = _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            }
          }
          if (0x228 < lVar8) {
            uVar22 = uVar22 >> 2;
            lVar17 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
            iVar1 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var9._M_current[uVar22 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            lVar17 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
            iVar1 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            end._M_current[-uVar22].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            if (0xc00 < lVar8) {
              lVar8 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar8;
              iVar1 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[uVar22 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar8 = _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar8;
              iVar1 = _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[uVar22 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              uVar11 = ~uVar22;
              lVar8 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar8;
              iVar1 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[uVar11].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar17 = -2 - uVar22;
              lVar8 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar8;
              iVar1 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[lVar17].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            }
          }
        }
        else if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_60 = _Var10._M_current;
          local_48 = _Var9._M_current;
          if (begin._M_current == _Var9._M_current) {
LAB_0032c881:
            if (local_60 == end._M_current) goto LAB_0032c9ee;
            lVar8 = 0x18;
            lVar17 = 0;
            uVar11 = 0;
            do {
              ptVar16 = (tuple<long,_int,_int,_int> *)
                        ((long)&local_48[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                super__Head_base<3UL,_int,_false>._M_head_impl + lVar8);
              if (ptVar16 == end._M_current) goto LAB_0032c3be;
              ptVar18 = (tuple<long,_int,_int,_int> *)
                        ((long)&(local_48->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                super__Head_base<3UL,_int,_false>._M_head_impl + lVar8);
              local_50 = uVar11;
              bVar7 = std::
                      __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                      ::__less(ptVar16,ptVar18);
              uVar11 = local_50;
              if (bVar7) {
                iVar1 = (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
                iVar2 = ptVar18[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl;
                iVar3 = ptVar18[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl;
                lVar21 = ptVar18[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
                ptVar18[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl =
                     (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
                ptVar18[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                     (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                ptVar19 = ptVar16;
                lVar20 = lVar17;
                if (lVar8 != 0x18) {
                  do {
                    ptVar12 = ptVar18 + -1;
                    lVar6 = ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                            super__Head_base<0UL,_long,_false>._M_head_impl;
                    if (lVar6 <= lVar21) {
                      if (lVar6 < lVar21) {
                        ptVar19 = ptVar18 + 1;
                        break;
                      }
                      iVar4 = ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.
                              super__Head_base<1UL,_int,_false>._M_head_impl;
                      if ((iVar4 <= iVar3) &&
                         ((iVar4 < iVar3 ||
                          ((iVar4 = ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                    super__Tuple_impl<1UL,_int,_int,_int>.
                                    super__Tuple_impl<2UL,_int,_int>.
                                    super__Head_base<2UL,_int,_false>._M_head_impl, iVar4 <= iVar2
                           && ((iVar4 < iVar2 ||
                               ((ptVar12->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                super__Head_base<3UL,_int,_false>._M_head_impl <= iVar1))))))))
                      break;
                    }
                    (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Head_base<0UL,_long,_false>._M_head_impl = lVar6;
                    (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl = ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                   super__Tuple_impl<1UL,_int,_int,_int>.
                                   super__Head_base<1UL,_int,_false>._M_head_impl;
                    (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                         ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                    lVar20 = lVar20 + 0x18;
                    ptVar19 = ptVar18;
                    ptVar18 = ptVar12;
                  } while (lVar20 != 0);
                }
                ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl = lVar21;
                ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = iVar3;
                ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
                (ptVar18->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
                uVar11 = local_50 + ((long)ptVar16 - (long)ptVar18 >> 3) * -0x5555555555555555;
              }
              lVar8 = lVar8 + 0x18;
              lVar17 = lVar17 + -0x18;
              _Var9._M_current = local_48;
              _Var10._M_current = local_60;
            } while (uVar11 < 9);
          }
          else {
            lVar8 = 0;
            uVar11 = 0;
            _Var13._M_current = begin._M_current;
            do {
              ptVar16 = _Var13._M_current + 1;
              if (ptVar16 == local_48) goto LAB_0032c881;
              bVar7 = std::
                      __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                      ::__less(ptVar16,_Var13._M_current);
              if (bVar7) {
                iVar1 = _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
                iVar2 = _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl;
                iVar3 = _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl;
                lVar17 = _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
                _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl =
                     ((_Var13._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
                _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = ((_Var13._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                _Var13._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                     ((_Var13._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                ptVar18 = ptVar16;
                lVar21 = lVar8;
                if (_Var13._M_current != begin._M_current) {
                  do {
                    ptVar19 = _Var13._M_current;
                    ptVar12 = ptVar19 + -1;
                    lVar20 = ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                             super__Head_base<0UL,_long,_false>._M_head_impl;
                    if (lVar20 <= lVar17) {
                      _Var13._M_current = ptVar19;
                      if (lVar20 < lVar17) {
                        ptVar18 = ptVar19 + 1;
                        break;
                      }
                      iVar4 = ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.
                              super__Head_base<1UL,_int,_false>._M_head_impl;
                      if ((iVar4 <= iVar3) &&
                         ((iVar4 < iVar3 ||
                          ((iVar4 = ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                    super__Tuple_impl<1UL,_int,_int,_int>.
                                    super__Tuple_impl<2UL,_int,_int>.
                                    super__Head_base<2UL,_int,_false>._M_head_impl, iVar4 <= iVar2
                           && ((iVar4 < iVar2 ||
                               ((ptVar12->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                super__Head_base<3UL,_int,_false>._M_head_impl <= iVar1))))))))
                      break;
                    }
                    (ptVar19->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Head_base<0UL,_long,_false>._M_head_impl = lVar20;
                    (ptVar19->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl = ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                   super__Tuple_impl<1UL,_int,_int,_int>.
                                   super__Head_base<1UL,_int,_false>._M_head_impl;
                    (ptVar19->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                         ptVar19[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                    lVar21 = lVar21 + 0x18;
                    _Var13._M_current = ptVar12;
                    ptVar18 = ptVar19;
                  } while (lVar21 != 0);
                }
                ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl = lVar17;
                ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = iVar3;
                ptVar18[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
                ((_Var13._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
                uVar11 = uVar11 + ((long)ptVar16 - (long)_Var13._M_current >> 3) *
                                  -0x5555555555555555;
              }
              lVar8 = lVar8 + -0x18;
              _Var13._M_current = ptVar16;
              _Var9._M_current = local_48;
              _Var10._M_current = local_60;
            } while (uVar11 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
                  (begin._M_current,_Var9._M_current,local_68,local_6c & 1);
        bVar7 = false;
        local_6c = 0;
      }
      else {
        _Var10 = partition_left<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                           (begin._M_current,end._M_current);
        _Var10._M_current = _Var10._M_current + 1;
        bVar7 = false;
      }
    }
LAB_0032c9f1:
    begin._M_current = _Var10._M_current;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }